

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O3

uint32_t __thiscall
icu_63::CollationDataBuilder::setPrimaryRangeAndReturnNext
          (CollationDataBuilder *this,UChar32 start,UChar32 end,uint32_t primary,int32_t step,
          UErrorCode *errorCode)

{
  UBool UVar1;
  int iVar2;
  uint32_t uVar3;
  
  uVar3 = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar2 = (*(this->super_UObject)._vptr_UObject[3])(this,(ulong)(primary >> 0x18));
    UVar1 = maybeSetPrimaryRange(this,start,end,primary,step,errorCode);
    if (UVar1 != '\0') {
      uVar3 = Collation::incThreeBytePrimaryByOffset
                        (primary,(UBool)iVar2,((end - start) + 1) * step);
      return uVar3;
    }
    if (end <= start) {
      end = start;
    }
    uVar3 = primary;
    do {
      utrie2_set32_63(this->trie,start,uVar3 | 0xc1,errorCode);
      start = start + 1;
      uVar3 = Collation::incThreeBytePrimaryByOffset(uVar3,(UBool)iVar2,step);
    } while (end + 1 != start);
  }
  return uVar3;
}

Assistant:

uint32_t
CollationDataBuilder::setPrimaryRangeAndReturnNext(UChar32 start, UChar32 end,
                                                   uint32_t primary, int32_t step,
                                                   UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    UBool isCompressible = isCompressiblePrimary(primary);
    if(maybeSetPrimaryRange(start, end, primary, step, errorCode)) {
        return Collation::incThreeBytePrimaryByOffset(primary, isCompressible,
                                                      (end - start + 1) * step);
    } else {
        // Short range: Set individual CE32s.
        for(;;) {
            utrie2_set32(trie, start, Collation::makeLongPrimaryCE32(primary), &errorCode);
            ++start;
            primary = Collation::incThreeBytePrimaryByOffset(primary, isCompressible, step);
            if(start > end) { return primary; }
        }
        modified = TRUE;
    }
}